

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_write_tile_chunk_info
          (exr_context_t ctxt,int part_index,int tilex,int tiley,int levelx,int levely,
          exr_chunk_info_t *cinfo)

{
  long lVar1;
  uint *puVar2;
  int *piVar3;
  int in_ECX;
  int iVar4;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 *in_stack_00000008;
  exr_attr_chlist_entry_t *curc;
  int c;
  int64_t sz_1;
  int64_t sz;
  exr_priv_part_t part;
  exr_chunk_info_t nil;
  uint64_t unpacksize;
  int tileh;
  int tilew;
  exr_attr_tiledesc_t *tiledesc;
  exr_attr_chlist_t *chanlist;
  int cidx;
  exr_result_t rv;
  undefined4 *puVar5;
  exr_const_context_t in_stack_ffffffffffffff40;
  int local_ac;
  undefined1 local_90 [8];
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  exr_const_priv_part_t in_stack_ffffffffffffff88;
  exr_const_context_t in_stack_ffffffffffffff90;
  int32_t *chunkoffout;
  uint local_48;
  uint local_44;
  undefined4 local_2c;
  exr_result_t local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  char *local_10;
  exr_result_t local_4;
  
  chunkoffout = (int32_t *)0x0;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_90,0,0x40);
  if (local_10 == (char *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffff40);
    if ((local_14 < 0) || (*(int *)(local_10 + 0xc4) <= local_14)) {
      internal_exr_unlock(in_stack_ffffffffffffff40);
      local_4 = (**(code **)(local_10 + 0x48))(local_10,4,"Part index (%d) out of range",local_14);
    }
    else {
      lVar1 = *(long *)(*(long *)(local_10 + 0x1d8) + (long)local_14 * 8);
      if (in_stack_00000008 == (undefined4 *)0x0) {
        internal_exr_unlock(in_stack_ffffffffffffff40);
        local_4 = (**(code **)(local_10 + 0x38))(local_10,3);
      }
      else if ((*(int *)(lVar1 + 4) == 0) || (*(int *)(lVar1 + 4) == 2)) {
        internal_exr_unlock(in_stack_ffffffffffffff40);
        local_4 = (**(code **)(local_10 + 0x38))(local_10,0x13);
      }
      else if (*local_10 == '\x03') {
        local_2c = 0;
        puVar5 = &local_2c;
        local_28 = validate_and_compute_tile_chunk_off
                             (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                              in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,chunkoffout);
        if (local_28 == 0) {
          puVar2 = *(uint **)(*(long *)(lVar1 + 0x60) + 0x18);
          local_44 = *(uint *)(*(long *)(lVar1 + 0xd8) + (long)local_20 * 4);
          if (*puVar2 < local_44) {
            local_44 = *puVar2;
          }
          local_48 = *(uint *)(*(long *)(lVar1 + 0xe0) + (long)local_24 * 4);
          if (puVar2[1] < local_48) {
            local_48 = puVar2[1];
          }
          if ((long)*(int *)(lVar1 + 0x98) <
              (long)local_18 * (long)(int)local_44 + (long)(int)local_44 +
              (long)*(int *)(lVar1 + 0x90) + -1) {
            local_44 = ((*(int *)(lVar1 + 0x98) - *(int *)(lVar1 + 0x90)) + 1) - local_18 * local_44
            ;
          }
          if ((long)*(int *)(lVar1 + 0x9c) <
              (long)local_1c * (long)(int)local_48 + (long)(int)local_48 +
              (long)*(int *)(lVar1 + 0x94) + -1) {
            local_48 = ((*(int *)(lVar1 + 0x9c) - *(int *)(lVar1 + 0x94)) + 1) - local_1c * local_48
            ;
          }
          memcpy(in_stack_00000008,local_90,0x40);
          *in_stack_00000008 = local_2c;
          *(char *)((long)in_stack_00000008 + 0x16) = (char)*(undefined4 *)(lVar1 + 4);
          *(char *)((long)in_stack_00000008 + 0x17) = (char)*(undefined4 *)(lVar1 + 0xb0);
          in_stack_00000008[1] = local_18;
          in_stack_00000008[2] = local_1c;
          in_stack_00000008[3] = local_48;
          in_stack_00000008[4] = local_44;
          if ((local_20 < 0x100) && (local_24 < 0x100)) {
            *(char *)(in_stack_00000008 + 5) = (char)local_20;
            *(char *)((long)in_stack_00000008 + 0x15) = (char)local_24;
            piVar3 = *(int **)(*(long *)(lVar1 + 0x20) + 0x18);
            for (local_ac = 0; local_ac < *piVar3; local_ac = local_ac + 1) {
              iVar4 = 4;
              if (*(int *)(*(long *)(piVar3 + 2) + (long)local_ac * 0x20 + 0x10) == 1) {
                iVar4 = 2;
              }
              chunkoffout = (int32_t *)
                            ((long)(int)local_44 * (long)(int)local_48 * (long)iVar4 +
                            (long)chunkoffout);
            }
            *(undefined8 *)(in_stack_00000008 + 0xc) = 0;
            *(undefined8 *)(in_stack_00000008 + 0xe) = 0;
            *(undefined8 *)(in_stack_00000008 + 6) = 0;
            *(undefined8 *)(in_stack_00000008 + 8) = 0;
            *(int32_t **)(in_stack_00000008 + 10) = chunkoffout;
            internal_exr_unlock(in_stack_ffffffffffffff40);
            local_4 = 0;
          }
          else {
            local_4 = (**(code **)(local_10 + 0x48))
                                (local_10,0x11,
                                 "Unable to represent tile level %d, %d in chunk structure",local_20
                                 ,local_24,*(code **)(local_10 + 0x48),puVar5);
          }
        }
        else {
          internal_exr_unlock(in_stack_ffffffffffffff40);
          local_4 = local_28;
        }
      }
      else if (*local_10 == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffff40);
        local_4 = (**(code **)(local_10 + 0x38))(local_10,9);
      }
      else {
        internal_exr_unlock(in_stack_ffffffffffffff40);
        local_4 = (**(code **)(local_10 + 0x38))(local_10,8);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_write_tile_chunk_info (
    exr_context_t     ctxt,
    int               part_index,
    int               tilex,
    int               tiley,
    int               levelx,
    int               levely,
    exr_chunk_info_t* cinfo)
{
    exr_result_t               rv;
    int                        cidx;
    const exr_attr_chlist_t*   chanlist;
    const exr_attr_tiledesc_t* tiledesc;
    int                        tilew, tileh;
    uint64_t                   unpacksize = 0;
    exr_chunk_info_t           nil        = {0};

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (!cinfo)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_TILE_SCAN_MIXEDAPI));
    }

    if (ctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (ctxt->mode == EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN (
                ctxt->standard_error (ctxt, EXR_ERR_HEADER_NOT_WRITTEN));
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    }

    cidx = 0;
    rv   = validate_and_compute_tile_chunk_off (
        ctxt, part, tilex, tiley, levelx, levely, &cidx);
    if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN (rv);

    tiledesc = part->tiles->tiledesc;
    tilew    = part->tile_level_tile_size_x[levelx];
    if (tiledesc->x_size < (uint32_t) tilew) tilew = (int) tiledesc->x_size;
    tileh = part->tile_level_tile_size_y[levely];
    if (tiledesc->y_size < (uint32_t) tileh) tileh = (int) tiledesc->y_size;

    if (((int64_t) (tilex) * (int64_t) (tilew) + (int64_t) (tilew) +
         (int64_t) (part->data_window.min.x) - 1) >
        (int64_t) (part->data_window.max.x))
    {
        int64_t sz = (int64_t) (part->data_window.max.x) -
                     (int64_t) (part->data_window.min.x) + 1;
        tilew = (int) (sz - ((int64_t) (tilex) * (int64_t) (tilew)));
    }

    if (((int64_t) (tiley) * (int64_t) (tileh) + (int64_t) (tileh) +
         (int64_t) (part->data_window.min.y) - 1) >
        (int64_t) (part->data_window.max.y))
    {
        int64_t sz = (int64_t) (part->data_window.max.y) -
                     (int64_t) (part->data_window.min.y) + 1;
        tileh = (int) (sz - ((int64_t) (tiley) * (int64_t) (tileh)));
    }

    *cinfo             = nil;
    cinfo->idx         = cidx;
    cinfo->type        = (uint8_t) part->storage_mode;
    cinfo->compression = (uint8_t) part->comp_type;
    cinfo->start_x     = tilex;
    cinfo->start_y     = tiley;
    cinfo->height      = tileh;
    cinfo->width       = tilew;
    if (levelx > 255 || levely > 255)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Unable to represent tile level %d, %d in chunk structure",
            levelx,
            levely);

    cinfo->level_x = (uint8_t) levelx;
    cinfo->level_y = (uint8_t) levely;

    chanlist = part->channels->chlist;
    for (int c = 0; c < chanlist->num_channels; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        unpacksize += (uint64_t) (tilew) * (uint64_t) (tileh) *
                      (uint64_t) ((curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4);
    }

    cinfo->sample_count_data_offset = 0;
    cinfo->sample_count_table_size  = 0;
    cinfo->data_offset              = 0;
    cinfo->packed_size              = 0;
    cinfo->unpacked_size            = unpacksize;

    return EXR_UNLOCK_AND_RETURN (EXR_ERR_SUCCESS);
}